

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O0

bool __thiscall libmatroska::KaxBlockBlob::ReplaceSimpleByGroup(KaxBlockBlob *this)

{
  KaxBlockGroup *pKVar1;
  KaxSimpleBlock *old_simpleblock;
  KaxBlockBlob *this_local;
  
  if (this->SimpleBlockMode == BLOCK_BLOB_ALWAYS_SIMPLE) {
    this_local._7_1_ = false;
  }
  else {
    if ((this->bUseSimpleBlock & 1U) == 0) {
      if ((this->Block).group == (KaxBlockGroup *)0x0) {
        pKVar1 = (KaxBlockGroup *)operator_new(0xb8);
        KaxBlockGroup::KaxBlockGroup(pKVar1);
        (this->Block).group = pKVar1;
      }
    }
    else {
      if ((this->Block).group != (KaxBlockGroup *)0x0) {
        pKVar1 = (KaxBlockGroup *)operator_new(0xb8);
        KaxBlockGroup::KaxBlockGroup(pKVar1);
        (this->Block).group = pKVar1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                      ,0x413,"bool libmatroska::KaxBlockBlob::ReplaceSimpleByGroup()");
      }
      pKVar1 = (KaxBlockGroup *)operator_new(0xb8);
      KaxBlockGroup::KaxBlockGroup(pKVar1);
      (this->Block).group = pKVar1;
    }
    if (this->ParentCluster != (KaxCluster *)0x0) {
      KaxBlockGroup::SetParent((this->Block).group,this->ParentCluster);
    }
    this->bUseSimpleBlock = false;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool KaxBlockBlob::ReplaceSimpleByGroup()
{
  if (SimpleBlockMode== BLOCK_BLOB_ALWAYS_SIMPLE)
    return false;

  if (!bUseSimpleBlock) {
    if (Block.group == NULL) {
      Block.group = new KaxBlockGroup();
    }
  }
#if MATROSKA_VERSION >= 2
  else {

    if (Block.simpleblock != NULL) {
      KaxSimpleBlock *old_simpleblock = Block.simpleblock;
      Block.group = new KaxBlockGroup();
      // _TODO_ : move all the data to the blockgroup
      assert(false);
      // -> while(frame) AddFrame(myBuffer)
      delete old_simpleblock;
    } else {
      Block.group = new KaxBlockGroup();
    }
  }
#endif
  if (ParentCluster != NULL)
    Block.group->SetParent(*ParentCluster);

  bUseSimpleBlock = false;
  return true;
}